

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::UseBaseAccessChainForAccessChain
          (InterfaceVariableScalarReplacement *this,Instruction *access_chain,
          Instruction *base_access_chain)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Operand *pOVar4;
  bool bVar5;
  uint local_40;
  uint local_3c;
  uint32_t i_1;
  uint32_t i;
  OperandList new_operands;
  Instruction *base_access_chain_local;
  Instruction *access_chain_local;
  InterfaceVariableScalarReplacement *this_local;
  
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)base_access_chain;
  OVar1 = Instruction::opcode(base_access_chain);
  bVar5 = false;
  if (OVar1 == OpAccessChain) {
    OVar1 = Instruction::opcode(access_chain);
    bVar5 = false;
    if (OVar1 == OpAccessChain) {
      uVar2 = Instruction::GetSingleWordInOperand(access_chain,0);
      uVar3 = Instruction::result_id
                        ((Instruction *)
                         new_operands.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar5 = uVar2 == uVar3;
    }
  }
  if (!bVar5) {
    __assert_fail("base_access_chain->opcode() == spv::Op::OpAccessChain && access_chain->opcode() == spv::Op::OpAccessChain && access_chain->GetSingleWordInOperand(0) == base_access_chain->result_id()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x1c3,
                  "void spvtools::opt::InterfaceVariableScalarReplacement::UseBaseAccessChainForAccessChain(Instruction *, Instruction *)"
                 );
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i_1);
  local_3c = 0;
  while( true ) {
    uVar2 = Instruction::NumInOperands
                      ((Instruction *)
                       new_operands.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (uVar2 <= local_3c) break;
    pOVar4 = Instruction::GetInOperand
                       ((Instruction *)
                        new_operands.
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_3c);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spvtools::opt::Operand&>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&i_1,pOVar4)
    ;
    local_3c = local_3c + 1;
  }
  local_40 = 1;
  while( true ) {
    uVar2 = Instruction::NumInOperands(access_chain);
    if (uVar2 <= local_40) break;
    pOVar4 = Instruction::GetInOperand(access_chain,local_40);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spvtools::opt::Operand&>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&i_1,pOVar4)
    ;
    local_40 = local_40 + 1;
  }
  Instruction::SetInOperands(access_chain,(OperandList *)&i_1);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i_1);
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::UseBaseAccessChainForAccessChain(
    Instruction* access_chain, Instruction* base_access_chain) {
  assert(base_access_chain->opcode() == spv::Op::OpAccessChain &&
         access_chain->opcode() == spv::Op::OpAccessChain &&
         access_chain->GetSingleWordInOperand(0) ==
             base_access_chain->result_id());
  Instruction::OperandList new_operands;
  for (uint32_t i = 0; i < base_access_chain->NumInOperands(); ++i) {
    new_operands.emplace_back(base_access_chain->GetInOperand(i));
  }
  for (uint32_t i = 1; i < access_chain->NumInOperands(); ++i) {
    new_operands.emplace_back(access_chain->GetInOperand(i));
  }
  access_chain->SetInOperands(std::move(new_operands));
}